

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

string * __thiscall
helics::Federate::query_abi_cxx11_
          (string *__return_storage_ptr__,Federate *this,string_view target,string_view queryStr,
          HelicsSequencingModes mode)

{
  element_type *peVar1;
  bool bVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (target._M_len != 0) {
    __y._M_str = "federate";
    __y._M_len = 8;
    bVar2 = std::operator==(target,__y);
    if (!bVar2) {
      __y_00._M_str = (this->mName)._M_dataplus._M_p;
      __y_00._M_len = (this->mName)._M_string_length;
      bVar2 = std::operator==(target,__y_00);
      if (!bVar2) {
        peVar1 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (*peVar1->_vptr_Core[0x5e])
                  (&local_50,peVar1,target._M_len,target._M_str,queryStr._M_len,queryStr._M_str,mode
                  );
        goto LAB_002012b6;
      }
    }
  }
  query_abi_cxx11_(&local_50,this,queryStr,HELICS_SEQUENCING_MODE_FAST);
LAB_002012b6:
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string
    Federate::query(std::string_view target, std::string_view queryStr, HelicsSequencingModes mode)
{
    std::string res;
    if ((target.empty()) || (target == "federate") || (target == getName())) {
        res = query(queryStr);
    } else {
        res = coreObject->query(target, queryStr, mode);
    }
    return res;
}